

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

wchar_t map_bind(EditLine *el,wchar_t argc,wchar_t **argv)

{
  el_action_t *peVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  wchar_t wVar6;
  wchar_t *pwVar7;
  wchar_t *pwVar8;
  keymacro_value_t *pkVar9;
  el_bindings_t *peVar10;
  wint_t wVar11;
  ulong uVar12;
  wchar_t **ppwVar13;
  char *__format;
  FILE *__stream;
  ulong uVar14;
  el_bindings_t *peVar15;
  el_action_t *local_2048;
  wchar_t outbuf [1024];
  wchar_t inbuf [1024];
  
  wVar6 = L'\xffffffff';
  if (argv != (wchar_t **)0x0) {
    local_2048 = (el->el_map).key;
    bVar5 = true;
    bVar3 = false;
    bVar4 = false;
    bVar2 = false;
    for (ppwVar13 = argv + 2; pwVar7 = ppwVar13[-1], pwVar7 != (wchar_t *)0x0;
        ppwVar13 = ppwVar13 + 1) {
      if (*pwVar7 != L'-') {
        if (bVar2) {
          if (bVar3) {
            terminal_clear_arrow(el,pwVar7);
            return L'\xffffffff';
          }
          pwVar8 = *ppwVar13;
          if (pwVar8 == (wchar_t *)0x0) goto LAB_0011ad05;
        }
        else {
          pwVar7 = parse__string(inbuf,pwVar7);
          if (pwVar7 == (wchar_t *)0x0) {
            __stream = (FILE *)el->el_errfile;
            pwVar7 = *argv;
            __format = "%ls: Invalid \\ or ^ in instring.\n";
            goto LAB_0011ae95;
          }
          if (bVar3) {
            if ((pwVar7[1] == L'\0') && (local_2048[(byte)*pwVar7] != '\x19')) {
              local_2048[(byte)*pwVar7] = '\x1c';
            }
            else {
              keymacro_delete(el,pwVar7);
            }
            goto LAB_0011ad10;
          }
          pwVar8 = *ppwVar13;
          if (pwVar8 == (wchar_t *)0x0) {
            if ((*pwVar7 == L'\0') || (pwVar7[1] == L'\0')) {
              keymacro__decode_str(pwVar7,(char *)outbuf,0x400,"");
              peVar10 = (el->el_map).help;
              peVar15 = peVar10 + (el->el_map).nfunc;
              goto LAB_0011af73;
            }
            keymacro_print(el,pwVar7);
            goto LAB_0011ad10;
          }
        }
        if (bVar4) {
          pwVar8 = parse__string(outbuf,pwVar8);
          if (pwVar8 == (wchar_t *)0x0) {
            __stream = (FILE *)el->el_errfile;
            pwVar7 = *argv;
            __format = "%ls: Invalid \\ or ^ in outstring.\n";
LAB_0011ae95:
            fprintf(__stream,__format,pwVar7);
            return L'\xffffffff';
          }
          pkVar9 = keymacro_map_str(el,pwVar8);
          if (bVar2) {
            terminal_set_arrow(el,pwVar7,pkVar9,L'\x01');
          }
          else {
            keymacro_add(el,pwVar7,pkVar9,L'\x01');
          }
          local_2048[(byte)*pwVar7] = '\x19';
        }
        else {
          wVar6 = parse_cmd(el,pwVar8);
          if (wVar6 == L'\xffffffff') {
            fprintf((FILE *)el->el_errfile,"%ls: Invalid command `%ls\'.\n",*argv,*ppwVar13);
            return L'\xffffffff';
          }
          if (bVar2) {
            pkVar9 = keymacro_map_cmd(el,wVar6);
            terminal_set_arrow(el,pwVar7,pkVar9,L'\0');
            return L'\0';
          }
          if (pwVar7[1] != L'\0') {
            pkVar9 = keymacro_map_cmd(el,wVar6);
            keymacro_add(el,pwVar7,pkVar9,L'\0');
            local_2048[(byte)*pwVar7] = '\x19';
            return L'\0';
          }
          keymacro_clear(el,local_2048,pwVar7);
          local_2048[(byte)*pwVar7] = (el_action_t)wVar6;
        }
        goto LAB_0011ad10;
      }
      wVar6 = pwVar7[1];
      switch(wVar6) {
      case L'k':
        bVar2 = bVar5;
        break;
      case L'l':
        peVar10 = (el->el_map).help;
        peVar15 = peVar10 + (el->el_map).nfunc;
        for (; peVar10 < peVar15; peVar10 = peVar10 + 1) {
          fprintf((FILE *)el->el_outfile,"%ls\n\t%ls\n",peVar10->name,peVar10->description);
        }
        return L'\0';
      case L'm':
      case L'n':
      case L'o':
      case L'p':
      case L'q':
      case L't':
      case L'u':
switchD_0011abc3_caseD_6d:
        fprintf((FILE *)el->el_errfile,"%ls: Invalid switch `%lc\'.\n",*argv);
        break;
      case L'r':
        bVar3 = bVar5;
        break;
      case L's':
        bVar4 = bVar5;
        break;
      case L'v':
        map_init_vi(el);
        goto LAB_0011ad10;
      default:
        if (wVar6 != L'a') {
          if (wVar6 != L'e') goto switchD_0011abc3_caseD_6d;
          map_init_emacs(el);
          goto LAB_0011ad10;
        }
        local_2048 = (el->el_map).alt;
      }
    }
    fwrite("Standard key bindings\n",0x16,1,(FILE *)el->el_outfile);
    uVar14 = 0;
    uVar12 = 0;
    while( true ) {
      peVar1 = (el->el_map).key;
      wVar11 = (wint_t)uVar12;
      if (uVar14 == 0x100) break;
      if (peVar1[(int)wVar11] != peVar1[uVar14]) {
        map_print_some_keys(el,peVar1,wVar11,(int)uVar14 - 1);
        uVar12 = uVar14 & 0xffffffff;
      }
      uVar14 = uVar14 + 1;
    }
    map_print_some_keys(el,peVar1,wVar11,0xff);
    fwrite("Alternative key bindings\n",0x19,1,(FILE *)el->el_outfile);
    uVar14 = 0;
    uVar12 = 0;
    while( true ) {
      peVar1 = (el->el_map).alt;
      wVar11 = (wint_t)uVar12;
      if (uVar14 == 0x100) break;
      if (peVar1[(int)wVar11] != peVar1[uVar14]) {
        map_print_some_keys(el,peVar1,wVar11,(int)uVar14 - 1);
        uVar12 = uVar14 & 0xffffffff;
      }
      uVar14 = uVar14 + 1;
    }
    map_print_some_keys(el,peVar1,wVar11,0xff);
    fwrite("Multi-character bindings\n",0x19,1,(FILE *)el->el_outfile);
    pwVar7 = anon_var_dwarf_23874 + 3;
    keymacro_print(el,anon_var_dwarf_23874 + 3);
    fwrite("Arrow key bindings\n",0x13,1,(FILE *)el->el_outfile);
LAB_0011ad05:
    terminal_print_arrow(el,pwVar7);
LAB_0011ad10:
    wVar6 = L'\0';
  }
  return wVar6;
LAB_0011af73:
  if (peVar15 <= peVar10) goto LAB_0011ad10;
  if (peVar10->func == (uint)local_2048[(byte)*pwVar7]) {
    fprintf((FILE *)el->el_outfile,"%s\t->\t%ls\n",outbuf,peVar10->name);
    goto LAB_0011ad10;
  }
  peVar10 = peVar10 + 1;
  goto LAB_0011af73;
}

Assistant:

libedit_private int
map_bind(EditLine *el, int argc, const wchar_t **argv)
{
	el_action_t *map;
	int ntype, rem;
	const wchar_t *p;
	wchar_t inbuf[EL_BUFSIZ];
	wchar_t outbuf[EL_BUFSIZ];
	const wchar_t *in = NULL;
	wchar_t *out;
	el_bindings_t *bp, *ep;
	int cmd;
	int key;

	if (argv == NULL)
		return -1;

	map = el->el_map.key;
	ntype = XK_CMD;
	key = rem = 0;
	for (argc = 1; (p = argv[argc]) != NULL; argc++)
		if (p[0] == '-')
			switch (p[1]) {
			case 'a':
				map = el->el_map.alt;
				break;

			case 's':
				ntype = XK_STR;
				break;
			case 'k':
				key = 1;
				break;

			case 'r':
				rem = 1;
				break;

			case 'v':
				map_init_vi(el);
				return 0;

			case 'e':
				map_init_emacs(el);
				return 0;

			case 'l':
				ep = &el->el_map.help[el->el_map.nfunc];
				for (bp = el->el_map.help; bp < ep; bp++)
					(void) fprintf(el->el_outfile,
					    "%ls\n\t%ls\n",
					    bp->name, bp->description);
				return 0;
			default:
				(void) fprintf(el->el_errfile,
				    "%ls: Invalid switch `%lc'.\n",
				    argv[0], (wint_t)p[1]);
			}
		else
			break;

	if (argv[argc] == NULL) {
		map_print_all_keys(el);
		return 0;
	}
	if (key)
		in = argv[argc++];
	else if ((in = parse__string(inbuf, argv[argc++])) == NULL) {
		(void) fprintf(el->el_errfile,
		    "%ls: Invalid \\ or ^ in instring.\n",
		    argv[0]);
		return -1;
	}
	if (rem) {
		if (key) {
			(void) terminal_clear_arrow(el, in);
			return -1;
		}
		if (in[1])
			(void) keymacro_delete(el, in);
		else if (map[(unsigned char) *in] == ED_SEQUENCE_LEAD_IN)
			(void) keymacro_delete(el, in);
		else
			map[(unsigned char) *in] = ED_UNASSIGNED;
		return 0;
	}
	if (argv[argc] == NULL) {
		if (key)
			terminal_print_arrow(el, in);
		else
			map_print_key(el, map, in);
		return 0;
	}
#ifdef notyet
	if (argv[argc + 1] != NULL) {
		bindkeymacro_usage();
		return -1;
	}
#endif

	switch (ntype) {
	case XK_STR:
		if ((out = parse__string(outbuf, argv[argc])) == NULL) {
			(void) fprintf(el->el_errfile,
			    "%ls: Invalid \\ or ^ in outstring.\n", argv[0]);
			return -1;
		}
		if (key)
			terminal_set_arrow(el, in, keymacro_map_str(el, out), ntype);
		else
			keymacro_add(el, in, keymacro_map_str(el, out), ntype);
		map[(unsigned char) *in] = ED_SEQUENCE_LEAD_IN;
		break;

	case XK_CMD:
		if ((cmd = parse_cmd(el, argv[argc])) == -1) {
			(void) fprintf(el->el_errfile,
			    "%ls: Invalid command `%ls'.\n",
			    argv[0], argv[argc]);
			return -1;
		}
		if (key)
			terminal_set_arrow(el, in, keymacro_map_cmd(el, cmd), ntype);
		else {
			if (in[1]) {
				keymacro_add(el, in, keymacro_map_cmd(el, cmd), ntype);
				map[(unsigned char) *in] = ED_SEQUENCE_LEAD_IN;
			} else {
				keymacro_clear(el, map, in);
				map[(unsigned char) *in] = (el_action_t)cmd;
			}
		}
		break;

	/* coverity[dead_error_begin] */
	default:
		EL_ABORT((el->el_errfile, "Bad XK_ type %d\n", ntype));
		break;
	}
	return 0;
}